

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O0

Mat3x3d * __thiscall OpenMD::Atom::getI(Atom *this)

{
  SquareMatrix3<double> *in_RDI;
  SquareMatrix<double,_3> *in_stack_ffffffffffffff78;
  
  SquareMatrix<double,_3>::identity();
  SquareMatrix3<double>::SquareMatrix3(in_RDI,in_stack_ffffffffffffff78);
  SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x31b45b);
  return in_RDI;
}

Assistant:

Mat3x3d Atom::getI() { return Mat3x3d::identity(); }